

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O2

bool boost::xpressive::cpp_regex_traits<char>::
     compare_<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
               (char_type *name,
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     end)

{
  char cVar1;
  
  for (; (cVar1 = *name, cVar1 != '\0' && (begin._M_current != end._M_current));
      begin._M_current = begin._M_current + 1) {
    if (cVar1 != *begin._M_current) {
      return false;
    }
    name = name + 1;
  }
  return cVar1 == '\0' && begin._M_current == end._M_current;
}

Assistant:

static bool compare_(char_type const *name, FwdIter begin, FwdIter end)
    {
        for(; *name && begin != end; ++name, ++begin)
        {
            if(*name != *begin)
            {
                return false;
            }
        }
        return !*name && begin == end;
    }